

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

int __thiscall cmProcess::GetNextOutputLine(cmProcess *this,string *line,double timeout)

{
  Buffer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  int length;
  char *data;
  int local_44;
  char *local_40;
  double local_38;
  
  this_00 = &this->Output;
  iVar3 = 2;
  local_38 = timeout;
  do {
    bVar1 = Buffer::GetLine(this_00,line);
    if (bVar1) {
      return 2;
    }
    iVar2 = cmsysProcess_WaitForData(this->Process,&local_40,&local_44,&local_38);
    if (iVar2 == 0xff) {
      iVar2 = 1;
    }
    else if (iVar2 == 2) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)this_00,
                 (this->Output).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish,local_40,local_40 + local_44);
      iVar2 = 0;
    }
    else {
      iVar2 = 2;
    }
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    iVar3 = 0xff;
  }
  else {
    bVar1 = Buffer::GetLast(this_00,line);
    if (!bVar1) {
      iVar2 = cmsysProcess_WaitForExit(this->Process,&local_38);
      iVar3 = 0xff;
      if (iVar2 != 0) {
        iVar3 = cmsysProcess_GetExitValue(this->Process);
        this->ExitValue = iVar3;
        dVar4 = cmsys::SystemTools::GetTime();
        dVar4 = dVar4 - this->StartTime;
        this->TotalTime = (double)(~-(ulong)(dVar4 <= 0.0) & (ulong)dVar4);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int cmProcess::GetNextOutputLine(std::string& line, double timeout)
{
  for(;;)
    {
    // Look for lines already buffered.
    if(this->Output.GetLine(line))
      {
      return cmsysProcess_Pipe_STDOUT;
      }

    // Check for more data from the process.
    char* data;
    int length;
    int p = cmsysProcess_WaitForData(this->Process, &data, &length, &timeout);
    if(p == cmsysProcess_Pipe_Timeout)
      {
      return cmsysProcess_Pipe_Timeout;
      }
    else if(p == cmsysProcess_Pipe_STDOUT)
      {
      this->Output.insert(this->Output.end(), data, data+length);
      }
    else // p == cmsysProcess_Pipe_None
      {
      // The process will provide no more data.
      break;
      }
    }

  // Look for partial last lines.
  if(this->Output.GetLast(line))
    {
    return cmsysProcess_Pipe_STDOUT;
    }

  // No more data.  Wait for process exit.
  if(!cmsysProcess_WaitForExit(this->Process, &timeout))
    {
    return cmsysProcess_Pipe_Timeout;
    }

  // Record exit information.
  this->ExitValue = cmsysProcess_GetExitValue(this->Process);
  this->TotalTime = cmSystemTools::GetTime() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= 0.0)
    {
    this->TotalTime = 0.0;
    }
  //  std::cerr << "Time to run: " << this->TotalTime << "\n";
  return cmsysProcess_Pipe_None;
}